

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::generateGOST
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pPublicKeyTemplate,
          CK_ULONG ulPublicKeyAttributeCount,CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
          CK_ULONG ulPrivateKeyAttributeCount,CK_OBJECT_HANDLE_PTR phPublicKey,
          CK_OBJECT_HANDLE_PTR phPrivateKey,CK_BBOOL isPublicKeyOnToken,CK_BBOOL isPublicKeyPrivate,
          CK_BBOOL isPrivateKeyOnToken,CK_BBOOL isPrivateKeyPrivate)

{
  CK_RV CVar1;
  void *pvVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  Session *this_00;
  Token *this_01;
  size_t sVar6;
  CryptoFactory *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar8;
  long *plVar9;
  char *pcVar10;
  ByteString *pBVar11;
  CK_ULONG CVar12;
  CK_ULONG CVar13;
  unsigned_long *puVar14;
  CK_ULONG i;
  ulong uVar15;
  bool bVar16;
  CK_RV CStack_590;
  AsymmetricKeyPair *kp;
  CK_ATTRIBUTE_PTR local_560;
  long *local_558;
  CK_SESSION_HANDLE local_550;
  CK_ULONG local_548;
  ByteString point;
  OSAttribute local_518;
  long *local_478;
  CK_ULONG local_470;
  CK_KEY_TYPE publicKeyType;
  CK_OBJECT_CLASS publicKeyClass;
  ByteString local_418;
  ByteString param_c;
  ByteString local_3c8;
  ByteString local_3a0;
  CK_KEY_TYPE privateKeyType;
  CK_OBJECT_CLASS privateKeyClass;
  ECParameters p;
  CK_ATTRIBUTE publicKeyAttribs [32];
  
  *phPublicKey = 0;
  *phPrivateKey = 0;
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  local_548 = ulPublicKeyAttributeCount;
  this_01 = Session::getToken(this_00);
  if (this_01 == (Token *)0x0) {
    return 5;
  }
  ByteString::ByteString(&local_3a0);
  ByteString::ByteString(&local_418);
  local_560 = pPrivateKeyTemplate;
  local_550 = hSession;
  local_470 = ulPrivateKeyAttributeCount;
  ByteString::ByteString(&local_3c8);
  puVar14 = &pPublicKeyTemplate->ulValueLen;
  CVar13 = local_548;
  while (bVar16 = CVar13 != 0, CVar13 = CVar13 - 1, bVar16) {
    sVar6 = ((_CK_ATTRIBUTE *)(puVar14 + -2))->type;
    if (sVar6 == 0x252) {
      ByteString::ByteString((ByteString *)publicKeyAttribs,(uchar *)puVar14[-1],*puVar14);
      ByteString::operator=(&local_3c8,(ByteString *)publicKeyAttribs);
LAB_0013ee71:
      ByteString::~ByteString((ByteString *)publicKeyAttribs);
    }
    else {
      if (sVar6 == 0x251) {
        ByteString::ByteString((ByteString *)publicKeyAttribs,(uchar *)puVar14[-1],*puVar14);
        ByteString::operator=(&local_418,(ByteString *)publicKeyAttribs);
        goto LAB_0013ee71;
      }
      if (sVar6 == 0x250) {
        ByteString::ByteString((ByteString *)publicKeyAttribs,(uchar *)puVar14[-1],*puVar14);
        ByteString::operator=(&local_3a0,(ByteString *)publicKeyAttribs);
        goto LAB_0013ee71;
      }
    }
    puVar14 = puVar14 + 3;
  }
  sVar6 = ByteString::size(&local_3a0);
  if ((sVar6 == 0) || (sVar6 = ByteString::size(&local_418), sVar6 == 0)) {
    CStack_590 = 0xd0;
    softHSMLog(6,"generateGOST",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2759,"Missing parameter(s) in pPublicKeyTemplate");
    goto LAB_0013f194;
  }
  ECParameters::ECParameters(&p);
  ECParameters::setEC(&p,&local_3a0);
  kp = (AsymmetricKeyPair *)0x0;
  pCVar7 = CryptoFactory::i();
  iVar5 = (*pCVar7->_vptr_CryptoFactory[2])(pCVar7,6);
  plVar8 = (long *)CONCAT44(extraout_var,iVar5);
  CStack_590 = 5;
  if (plVar8 != (long *)0x0) {
    cVar3 = (**(code **)(*plVar8 + 0x60))(plVar8,&kp,&p,0);
    if (cVar3 == '\0') {
      softHSMLog(3,"generateGOST",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2767,"Could not generate key pair");
      pCVar7 = CryptoFactory::i();
      (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,plVar8);
    }
    else {
      iVar5 = (*(kp->super_Serialisable)._vptr_Serialisable[3])();
      local_478 = (long *)CONCAT44(extraout_var_00,iVar5);
      local_558 = plVar8;
      iVar5 = (*(kp->super_Serialisable)._vptr_Serialisable[5])();
      plVar8 = (long *)CONCAT44(extraout_var_01,iVar5);
      publicKeyClass = 2;
      publicKeyType = 0x30;
      memset(publicKeyAttribs,0,0x300);
      publicKeyAttribs[0].ulValueLen = 8;
      publicKeyAttribs[1].type = 1;
      publicKeyAttribs[1].pValue = &isPublicKeyOnToken;
      publicKeyAttribs[1].ulValueLen = 1;
      publicKeyAttribs[2].type = 2;
      publicKeyAttribs[2].pValue = &isPublicKeyPrivate;
      publicKeyAttribs[2].ulValueLen = 1;
      publicKeyAttribs[3].type = 0x100;
      publicKeyAttribs[3].ulValueLen = 8;
      CVar13 = 4;
      for (uVar15 = 0; (local_548 < 0x1d && (uVar15 < local_548)); uVar15 = uVar15 + 1) {
        CVar12 = CVar13;
        if ((2 < pPublicKeyTemplate->type) && (pPublicKeyTemplate->type != 0x100)) {
          CVar12 = CVar13 + 1;
          publicKeyAttribs[CVar13].ulValueLen = pPublicKeyTemplate->ulValueLen;
          pvVar2 = pPublicKeyTemplate->pValue;
          publicKeyAttribs[CVar13].type = pPublicKeyTemplate->type;
          publicKeyAttribs[CVar13].pValue = pvVar2;
        }
        pPublicKeyTemplate = pPublicKeyTemplate + 1;
        CVar13 = CVar12;
      }
      CStack_590 = 0xd1;
      publicKeyAttribs[0].pValue = &publicKeyClass;
      publicKeyAttribs[3].pValue = &publicKeyType;
      if ((local_548 < 0x1d) &&
         (CStack_590 = CreateObject(this,local_550,publicKeyAttribs,CVar13,phPublicKey,4),
         CStack_590 == 0)) {
        plVar9 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
        CStack_590 = 6;
        CVar1 = 6;
        if ((plVar9 != (long *)0x0) &&
           ((cVar3 = (**(code **)(*plVar9 + 0x50))(plVar9), CStack_590 = CVar1, cVar3 != '\0' &&
            (cVar3 = (**(code **)(*plVar9 + 0x58))(plVar9,1), cVar3 != '\0')))) {
          OSAttribute::OSAttribute(&local_518,true);
          cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x163,&local_518);
          OSAttribute::~OSAttribute(&local_518);
          if (cVar3 == '\0') {
            cVar3 = '\0';
          }
          else {
            OSAttribute::OSAttribute(&local_518,0x1040);
            cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x166,&local_518);
            OSAttribute::~OSAttribute(&local_518);
          }
          ByteString::ByteString(&point);
          if (isPublicKeyPrivate == '\0') {
            pBVar11 = (ByteString *)(**(code **)(*local_478 + 0x40))();
            ByteString::operator=(&point,pBVar11);
          }
          else {
            pcVar10 = (char *)(**(code **)(*local_478 + 0x40))();
            Token::encrypt(this_01,pcVar10,(int)&point);
          }
          if (cVar3 != '\0') {
            OSAttribute::OSAttribute(&local_518,&point);
            cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x11,&local_518);
            OSAttribute::~OSAttribute(&local_518);
            if (cVar3 != '\0') {
              cVar3 = (**(code **)(*plVar9 + 0x60))(plVar9);
              ByteString::~ByteString(&point);
              if (cVar3 != '\0') {
                privateKeyClass = 3;
                privateKeyType = 0x30;
                memset(publicKeyAttribs,0,0x300);
                publicKeyAttribs[0].ulValueLen = 8;
                publicKeyAttribs[1].type = 1;
                publicKeyAttribs[1].pValue = &isPrivateKeyOnToken;
                publicKeyAttribs[1].ulValueLen = 1;
                publicKeyAttribs[2].type = 2;
                publicKeyAttribs[2].pValue = &isPrivateKeyPrivate;
                publicKeyAttribs[2].ulValueLen = 1;
                publicKeyAttribs[3].type = 0x100;
                publicKeyAttribs[3].ulValueLen = 8;
                CVar13 = 4;
                for (uVar15 = 0; (local_470 < 0x1d && (uVar15 < local_470)); uVar15 = uVar15 + 1) {
                  CVar12 = CVar13;
                  if ((2 < local_560->type) && (local_560->type != 0x100)) {
                    CVar12 = CVar13 + 1;
                    publicKeyAttribs[CVar13].ulValueLen = local_560->ulValueLen;
                    pvVar2 = local_560->pValue;
                    publicKeyAttribs[CVar13].type = local_560->type;
                    publicKeyAttribs[CVar13].pValue = pvVar2;
                  }
                  local_560 = local_560 + 1;
                  CVar13 = CVar12;
                }
                CStack_590 = 0xd1;
                publicKeyAttribs[0].pValue = &privateKeyClass;
                publicKeyAttribs[3].pValue = &privateKeyType;
                if ((local_470 < 0x1d) &&
                   (CStack_590 = CreateObject(this,local_550,publicKeyAttribs,CVar13,phPrivateKey,4)
                   , CStack_590 == 0)) {
                  plVar9 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
                  CStack_590 = 6;
                  if ((plVar9 != (long *)0x0) &&
                     ((cVar3 = (**(code **)(*plVar9 + 0x50))(plVar9), cVar3 != '\0' &&
                      (cVar3 = (**(code **)(*plVar9 + 0x58))(plVar9,1), cVar3 != '\0')))) {
                    OSAttribute::OSAttribute(&local_518,true);
                    cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x163,&local_518);
                    OSAttribute::~OSAttribute(&local_518);
                    if (cVar3 == '\0') {
                      cVar3 = '\0';
                    }
                    else {
                      OSAttribute::OSAttribute(&local_518,0x1040);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x166,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                    }
                    bVar16 = (bool)(**(code **)(*plVar9 + 0x20))(plVar9,0x103,0);
                    if (cVar3 == '\0') {
                      cVar3 = '\0';
                    }
                    else {
                      OSAttribute::OSAttribute(&local_518,bVar16);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x165,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                    }
                    bVar4 = (**(code **)(*plVar9 + 0x20))(plVar9,0x162,0);
                    if (cVar3 == '\0') {
                      cVar3 = '\0';
                    }
                    else {
                      OSAttribute::OSAttribute(&local_518,(bool)(bVar4 ^ 1));
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x164,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                    }
                    ByteString::ByteString(&point);
                    ByteString::ByteString((ByteString *)&publicKeyClass);
                    ByteString::ByteString((ByteString *)&publicKeyType);
                    ByteString::ByteString(&param_c);
                    if (isPrivateKeyPrivate == '\0') {
                      pBVar11 = (ByteString *)(**(code **)(*plVar8 + 0x50))(plVar8);
                      ByteString::operator=(&point,pBVar11);
                      pBVar11 = (ByteString *)(**(code **)(*plVar8 + 0x58))();
                      ByteString::operator=((ByteString *)&publicKeyClass,pBVar11);
                      ByteString::operator=((ByteString *)&publicKeyType,&local_418);
                      ByteString::operator=(&param_c,&local_3c8);
                    }
                    else {
                      pcVar10 = (char *)(**(code **)(*plVar8 + 0x50))(plVar8);
                      Token::encrypt(this_01,pcVar10,(int)&point);
                      pcVar10 = (char *)(**(code **)(*plVar8 + 0x58))();
                      Token::encrypt(this_01,pcVar10,(int)&publicKeyClass);
                      Token::encrypt(this_01,(char *)&local_418,(int)&publicKeyType);
                      Token::encrypt(this_01,(char *)&local_3c8,(int)&param_c);
                    }
                    if (cVar3 == '\0') {
LAB_0013f7a0:
                      (**(code **)(*plVar9 + 0x68))(plVar9);
                      CStack_590 = 6;
                    }
                    else {
                      OSAttribute::OSAttribute(&local_518,&point);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x11,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                      if (cVar3 == '\0') goto LAB_0013f7a0;
                      OSAttribute::OSAttribute(&local_518,(ByteString *)&publicKeyClass);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x250,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                      if (cVar3 == '\0') goto LAB_0013f7a0;
                      OSAttribute::OSAttribute(&local_518,(ByteString *)&publicKeyType);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x251,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                      if (cVar3 == '\0') goto LAB_0013f7a0;
                      OSAttribute::OSAttribute(&local_518,&param_c);
                      cVar3 = (**(code **)(*plVar9 + 0x40))(plVar9,0x252,&local_518);
                      OSAttribute::~OSAttribute(&local_518);
                      if (cVar3 == '\0') goto LAB_0013f7a0;
                      cVar3 = (**(code **)(*plVar9 + 0x60))(plVar9);
                      CStack_590 = 6;
                      if (cVar3 != '\0') {
                        CStack_590 = 0;
                      }
                    }
                    ByteString::~ByteString(&param_c);
                    ByteString::~ByteString((ByteString *)&publicKeyType);
                    ByteString::~ByteString((ByteString *)&publicKeyClass);
                    ByteString::~ByteString(&point);
                  }
                }
              }
              goto LAB_0013f0d4;
            }
          }
          (**(code **)(*plVar9 + 0x68))(plVar9);
          ByteString::~ByteString(&point);
        }
      }
LAB_0013f0d4:
      (**(code **)(*local_558 + 0xc0))(local_558,kp);
      pCVar7 = CryptoFactory::i();
      (*pCVar7->_vptr_CryptoFactory[3])(pCVar7,local_558);
      if (CStack_590 == 0) {
        CStack_590 = 0;
      }
      else {
        if (*phPrivateKey != 0) {
          plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPrivateKey);
          HandleManager::destroyObject(this->handleManager,*phPrivateKey);
          if (plVar8 != (long *)0x0) {
            (**(code **)(*plVar8 + 0x70))(plVar8);
          }
          *phPrivateKey = 0;
        }
        if (*phPublicKey != 0) {
          plVar8 = (long *)HandleManager::getObject(this->handleManager,*phPublicKey);
          HandleManager::destroyObject(this->handleManager,*phPublicKey);
          if (plVar8 != (long *)0x0) {
            (**(code **)(*plVar8 + 0x70))(plVar8);
          }
          *phPublicKey = 0;
        }
      }
    }
  }
  ECParameters::~ECParameters(&p);
LAB_0013f194:
  ByteString::~ByteString(&local_3c8);
  ByteString::~ByteString(&local_418);
  ByteString::~ByteString(&local_3a0);
  return CStack_590;
}

Assistant:

CK_RV SoftHSM::generateGOST
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pPublicKeyTemplate,
	CK_ULONG ulPublicKeyAttributeCount,
	CK_ATTRIBUTE_PTR pPrivateKeyTemplate,
	CK_ULONG ulPrivateKeyAttributeCount,
	CK_OBJECT_HANDLE_PTR phPublicKey,
	CK_OBJECT_HANDLE_PTR phPrivateKey,
	CK_BBOOL isPublicKeyOnToken,
	CK_BBOOL isPublicKeyPrivate,
	CK_BBOOL isPrivateKeyOnToken,
	CK_BBOOL isPrivateKeyPrivate)
{
	*phPublicKey = CK_INVALID_HANDLE;
	*phPrivateKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired key information
	ByteString param_3410;
	ByteString param_3411;
	ByteString param_28147;
	for (CK_ULONG i = 0; i < ulPublicKeyAttributeCount; i++)
	{
		switch (pPublicKeyTemplate[i].type)
		{
			case CKA_GOSTR3410_PARAMS:
				param_3410 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOSTR3411_PARAMS:
				param_3411 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			case CKA_GOST28147_PARAMS:
				param_28147 = ByteString((unsigned char*)pPublicKeyTemplate[i].pValue, pPublicKeyTemplate[i].ulValueLen);
				break;
			default:
				break;
		}
	}

	// The parameters must be specified to be able to generate a key pair.
	if (param_3410.size() == 0 || param_3411.size() == 0) {
		INFO_MSG("Missing parameter(s) in pPublicKeyTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// Set the parameters
	ECParameters p;
	p.setEC(param_3410);

	// Generate key pair
	AsymmetricKeyPair* kp = NULL;
	AsymmetricAlgorithm* gost = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
	if (gost == NULL) return CKR_GENERAL_ERROR;
	if (!gost->generateKeyPair(&kp, &p))
	{
		ERROR_MSG("Could not generate key pair");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);
		return CKR_GENERAL_ERROR;
	}

	GOSTPublicKey* pub = (GOSTPublicKey*) kp->getPublicKey();
	GOSTPrivateKey* priv = (GOSTPrivateKey*) kp->getPrivateKey();

	CK_RV rv = CKR_OK;

	// Create a public key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS publicKeyClass = CKO_PUBLIC_KEY;
		CK_KEY_TYPE publicKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE publicKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &publicKeyClass, sizeof(publicKeyClass) },
			{ CKA_TOKEN, &isPublicKeyOnToken, sizeof(isPublicKeyOnToken) },
			{ CKA_PRIVATE, &isPublicKeyPrivate, sizeof(isPublicKeyPrivate) },
			{ CKA_KEY_TYPE, &publicKeyType, sizeof(publicKeyType) },
		};
		CK_ULONG publicKeyAttribsCount = 4;

		// Add the additional
		if (ulPublicKeyAttributeCount > (maxAttribs - publicKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPublicKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPublicKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					publicKeyAttribs[publicKeyAttribsCount++] = pPublicKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,publicKeyAttribs,publicKeyAttribsCount,phPublicKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPublicKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// EC Public Key Attributes
				ByteString point;
				if (isPublicKeyPrivate)
				{
					token->encrypt(pub->getQ(), point);
				}
				else
				{
					point = pub->getQ();
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, point);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				rv = CKR_FUNCTION_FAILED;
		}
	}

	// Create a private key using C_CreateObject
	if (rv == CKR_OK)
	{
		const CK_ULONG maxAttribs = 32;
		CK_OBJECT_CLASS privateKeyClass = CKO_PRIVATE_KEY;
		CK_KEY_TYPE privateKeyType = CKK_GOSTR3410;
		CK_ATTRIBUTE privateKeyAttribs[maxAttribs] = {
			{ CKA_CLASS, &privateKeyClass, sizeof(privateKeyClass) },
			{ CKA_TOKEN, &isPrivateKeyOnToken, sizeof(isPrivateKeyOnToken) },
			{ CKA_PRIVATE, &isPrivateKeyPrivate, sizeof(isPrivateKeyPrivate) },
			{ CKA_KEY_TYPE, &privateKeyType, sizeof(privateKeyType) },
		};
		CK_ULONG privateKeyAttribsCount = 4;
		if (ulPrivateKeyAttributeCount > (maxAttribs - privateKeyAttribsCount))
			rv = CKR_TEMPLATE_INCONSISTENT;
		for (CK_ULONG i=0; i < ulPrivateKeyAttributeCount && rv == CKR_OK; ++i)
		{
			switch (pPrivateKeyTemplate[i].type)
			{
				case CKA_CLASS:
				case CKA_TOKEN:
				case CKA_PRIVATE:
				case CKA_KEY_TYPE:
					continue;
				default:
					privateKeyAttribs[privateKeyAttribsCount++] = pPrivateKeyTemplate[i];
			}
		}

		if (rv == CKR_OK)
			rv = this->CreateObject(hSession,privateKeyAttribs,privateKeyAttribsCount,phPrivateKey,OBJECT_OP_GENERATE);

		// Store the attributes that are being supplied by the key generation to the object
		if (rv == CKR_OK)
		{
			OSObject* osobject = (OSObject*)handleManager->getObject(*phPrivateKey);
			if (osobject == NULL_PTR || !osobject->isValid()) {
				rv = CKR_FUNCTION_FAILED;
			} else if (osobject->startTransaction()) {
				bool bOK = true;

				// Common Key Attributes
				bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
				CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_EC_KEY_PAIR_GEN;
				bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

				// Common Private Key Attributes
				bool bAlwaysSensitive = osobject->getBooleanValue(CKA_SENSITIVE, false);
				bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE,bAlwaysSensitive);
				bool bNeverExtractable = osobject->getBooleanValue(CKA_EXTRACTABLE, false) == false;
				bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, bNeverExtractable);

				// GOST Private Key Attributes
				ByteString value;
				ByteString param_a;
				ByteString param_b;
				ByteString param_c;
				if (isPrivateKeyPrivate)
				{
					token->encrypt(priv->getD(), value);
					token->encrypt(priv->getEC(), param_a);
					token->encrypt(param_3411, param_b);
					token->encrypt(param_28147, param_c);
				}
				else
				{
					value = priv->getD();
					param_a = priv->getEC();
					param_b = param_3411;
					param_c = param_28147;
				}
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3410_PARAMS, param_a);
				bOK = bOK && osobject->setAttribute(CKA_GOSTR3411_PARAMS, param_b);
				bOK = bOK && osobject->setAttribute(CKA_GOST28147_PARAMS, param_c);

				if (bOK)
					bOK = osobject->commitTransaction();
				else
					osobject->abortTransaction();

				if (!bOK)
					rv = CKR_FUNCTION_FAILED;
			} else
				  rv = CKR_FUNCTION_FAILED;
		}
	}

	// Clean up
	gost->recycleKeyPair(kp);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(gost);

	// Remove keys that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phPrivateKey != CK_INVALID_HANDLE)
		{
			OSObject* ospriv = (OSObject*)handleManager->getObject(*phPrivateKey);
			handleManager->destroyObject(*phPrivateKey);
			if (ospriv) ospriv->destroyObject();
			*phPrivateKey = CK_INVALID_HANDLE;
		}

		if (*phPublicKey != CK_INVALID_HANDLE)
		{
			OSObject* ospub = (OSObject*)handleManager->getObject(*phPublicKey);
			handleManager->destroyObject(*phPublicKey);
			if (ospub) ospub->destroyObject();
			*phPublicKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}